

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

TestObject * __thiscall kj::Arena::allocate<kj::(anonymous_namespace)::TestObject>(Arena *this)

{
  TestObject *location;
  
  location = (TestObject *)allocateBytes(this,4,4,true);
  ctor<kj::(anonymous_namespace)::TestObject>(location);
  setDestructor(this,location,destroyObject<kj::(anonymous_namespace)::TestObject>);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}